

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_3377::ProfileDataTest::ProfileDataTest(ProfileDataTest *this)

{
  char *pcVar1;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  char *__path;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ProfileDataTest_00153960;
  ProfileData::ProfileData(&this->collector_);
  (this->checker_).filename_._M_dataplus._M_p = (pointer)&(this->checker_).filename_.field_2;
  (this->checker_).filename_._M_string_length = 0;
  (this->checker_).filename_.field_2._M_local_buf[0] = '\0';
  pcVar1 = getenv("TMPDIR");
  __path = "/tmp";
  if (pcVar1 != (char *)0x0) {
    __path = pcVar1;
  }
  mkdir(__path,0x1ed);
  local_50[0] = local_40;
  sVar2 = strlen(__path);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,__path,__path + sVar2);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->checker_,(string *)&local_70);
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void ExpectStopped() {
    EXPECT_FALSE(collector_.enabled());
  }